

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O2

char * Sat_MmFixedEntryFetch(Sat_MmFixed_t *p)

{
  int iVar1;
  int iVar2;
  char **ppcVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  size_t __size;
  
  iVar2 = p->nEntriesUsed;
  if (iVar2 == p->nEntriesAlloc) {
    if (p->pEntriesFree != (char *)0x0) {
      __assert_fail("p->pEntriesFree == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satMem.c"
                    ,0xb1,"char *Sat_MmFixedEntryFetch(Sat_MmFixed_t *)");
    }
    iVar2 = p->nChunks;
    if (iVar2 == p->nChunksAlloc) {
      p->nChunksAlloc = iVar2 * 2;
      if (p->pChunks == (char **)0x0) {
        ppcVar3 = (char **)malloc((long)iVar2 << 4);
      }
      else {
        ppcVar3 = (char **)realloc(p->pChunks,(long)iVar2 << 4);
      }
      p->pChunks = ppcVar3;
    }
    iVar2 = p->nEntrySize;
    iVar1 = p->nChunkSize;
    __size = (long)iVar1 * (long)iVar2;
    pcVar4 = (char *)malloc(__size);
    p->pEntriesFree = pcVar4;
    p->nMemoryAlloc = p->nMemoryAlloc + (int)__size;
    pcVar6 = pcVar4;
    for (iVar5 = 1; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      *(char **)pcVar6 = pcVar6 + iVar2;
      pcVar6 = pcVar6 + iVar2;
    }
    pcVar6[0] = '\0';
    pcVar6[1] = '\0';
    pcVar6[2] = '\0';
    pcVar6[3] = '\0';
    pcVar6[4] = '\0';
    pcVar6[5] = '\0';
    pcVar6[6] = '\0';
    pcVar6[7] = '\0';
    iVar2 = p->nChunks;
    p->nChunks = iVar2 + 1;
    p->pChunks[iVar2] = pcVar4;
    p->nEntriesAlloc = p->nEntriesAlloc + iVar1;
    iVar2 = p->nEntriesUsed;
  }
  p->nEntriesUsed = iVar2 + 1;
  if (p->nEntriesMax <= iVar2) {
    p->nEntriesMax = iVar2 + 1;
  }
  pcVar6 = p->pEntriesFree;
  p->pEntriesFree = *(char **)pcVar6;
  return pcVar6;
}

Assistant:

char * Sat_MmFixedEntryFetch( Sat_MmFixed_t * p )
{
    char * pTemp;
    int i;

    // check if there are still free entries
    if ( p->nEntriesUsed == p->nEntriesAlloc )
    { // need to allocate more entries
        assert( p->pEntriesFree == NULL );
        if ( p->nChunks == p->nChunksAlloc )
        {
            p->nChunksAlloc *= 2;
            p->pChunks = ABC_REALLOC( char *, p->pChunks, p->nChunksAlloc ); 
        }
        p->pEntriesFree = ABC_ALLOC( char, p->nEntrySize * p->nChunkSize );
        p->nMemoryAlloc += p->nEntrySize * p->nChunkSize;
        // transform these entries into a linked list
        pTemp = p->pEntriesFree;
        for ( i = 1; i < p->nChunkSize; i++ )
        {
            *((char **)pTemp) = pTemp + p->nEntrySize;
            pTemp += p->nEntrySize;
        }
        // set the last link
        *((char **)pTemp) = NULL;
        // add the chunk to the chunk storage
        p->pChunks[ p->nChunks++ ] = p->pEntriesFree;
        // add to the number of entries allocated
        p->nEntriesAlloc += p->nChunkSize;
    }
    // incrememt the counter of used entries
    p->nEntriesUsed++;
    if ( p->nEntriesMax < p->nEntriesUsed )
        p->nEntriesMax = p->nEntriesUsed;
    // return the first entry in the free entry list
    pTemp = p->pEntriesFree;
    p->pEntriesFree = *((char **)pTemp);
    return pTemp;
}